

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_set1_requested_trust_anchors(SSL *ssl,uint8_t *ids,size_t ids_len)

{
  bool bVar1;
  uint uVar2;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Array<unsigned_char> copy;
  
  if ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl == (SSL_CONFIG *)0x0) {
    uVar2 = 0;
  }
  else {
    in.size_ = ids_len;
    in.data_ = (uchar *)ids_len;
    bVar1 = bssl::ssl_is_valid_trust_anchor_list((bssl *)ids,in);
    if (bVar1) {
      copy.data_ = (uchar *)0x0;
      copy.size_ = 0;
      in_00.size_ = ids_len;
      in_00.data_ = ids;
      bVar1 = bssl::Array<unsigned_char>::CopyFrom(&copy,in_00);
      if (bVar1) {
        std::optional<bssl::Array<unsigned_char>>::operator=
                  ((optional<bssl::Array<unsigned_char>> *)
                   &((ssl->config)._M_t.
                     super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                    requested_trust_anchors,&copy);
      }
      uVar2 = (uint)bVar1;
      bssl::Array<unsigned_char>::~Array(&copy);
    }
    else {
      uVar2 = 0;
      ERR_put_error(0x10,0,0x148,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0xd6a);
    }
  }
  return uVar2;
}

Assistant:

int SSL_set1_requested_trust_anchors(SSL *ssl, const uint8_t *ids,
                                     size_t ids_len) {
  if (!ssl->config) {
    return 0;
  }
  auto span = Span(ids, ids_len);
  if (!ssl_is_valid_trust_anchor_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_TRUST_ANCHOR_LIST);
    return 0;
  }
  Array<uint8_t> copy;
  if (!copy.CopyFrom(span)) {
    return 0;
  }
  ssl->config->requested_trust_anchors = std::move(copy);
  return 1;
}